

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateInternalForwardDeclarations
          (FileGenerator *this,CrossFileReferences *refs,Printer *printer)

{
  Options *d;
  cpp *this_00;
  long lVar1;
  __normal_iterator<const_google::protobuf::Descriptor_**,_std::vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>_>
  __last;
  ulong uVar2;
  code *options;
  Options *options_00;
  _Alloc_hider _Var3;
  __normal_iterator<const_google::protobuf::Descriptor_**,_std::vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>_>
  _Var4;
  Formatter format;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  sorted;
  NamespaceOpener ns;
  string local_f0;
  FileGenerator *local_d0;
  undefined1 local_c8 [32];
  Formatter local_a8;
  __normal_iterator<const_google::protobuf::Descriptor_**,_std::vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>_>
  local_70;
  __normal_iterator<const_google::protobuf::Descriptor_**,_std::vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>_>
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_48;
  undefined8 local_38;
  
  local_d0 = this;
  local_a8.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_a8.vars_._M_t,&(this->variables_)._M_t);
  local_58._0_8_ = local_a8.printer_;
  local_58._8_8_ = (AccessInfoMap *)0x0;
  aStack_48._M_allocated_capacity = 0;
  aStack_48._8_8_ = 0;
  options = (code *)&local_f0;
  std::
  vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>::
  vector<std::__detail::_Node_const_iterator<google::protobuf::Descriptor_const*,true,false>,void>
            ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
              *)&local_70,
             (_Node_const_iterator<const_google::protobuf::Descriptor_*,_true,_false>)
             (refs->weak_default_instances)._M_h._M_before_begin._M_nxt,
             (_Node_const_iterator<const_google::protobuf::Descriptor_*,_true,_false>)0x0,
             (allocator_type *)options);
  __last._M_current = local_68._M_current;
  _Var4._M_current = local_70._M_current;
  local_38 = refs;
  if (local_70._M_current != local_68._M_current) {
    uVar2 = (long)local_68._M_current - (long)local_70._M_current >> 3;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    options = anon_unknown_60::CompareSortKeys<google::protobuf::Descriptor>;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor_const**,std::vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*)>>
              (local_70,local_68,(ulong)(((uint)lVar1 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*)>
                )0x29c57a);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor_const**,std::vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*)>>
              (_Var4,__last,
               (_Iter_comp_iter<bool_(*)(const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*)>
                )0x29c57a);
  }
  if (local_70._M_current != local_68._M_current) {
    d = &local_d0->options_;
    _Var4._M_current = local_70._M_current;
    do {
      this_00 = (cpp *)*_Var4._M_current;
      Namespace_abi_cxx11_(&local_f0,this_00,(Descriptor *)d,(Options *)options);
      NamespaceOpener::ChangeTo((NamespaceOpener *)&local_58,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if ((local_d0->options_).lite_implicit_weak_fields == true) {
        DefaultInstanceType_abi_cxx11_(&local_f0,this_00,(Descriptor *)d,(Options *)options);
        DefaultInstanceName_abi_cxx11_
                  ((string *)local_c8,this_00,(Descriptor *)d,(Options *)options);
        options_00 = (Options *)local_c8;
        Formatter::operator()
                  (&local_a8,"extern $1$ $2$;\n",&local_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
        if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
          operator_delete((void *)local_c8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        DefaultInstanceType_abi_cxx11_(&local_f0,this_00,(Descriptor *)d,options_00);
        DefaultInstancePtr_abi_cxx11_((string *)local_c8,this_00,(Descriptor *)d,options_00);
        options = (code *)local_c8;
        Formatter::operator()
                  (&local_a8,"__attribute__((weak)) $1$* $2$ = nullptr;\n",&local_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
      }
      else {
        DefaultInstanceType_abi_cxx11_(&local_f0,this_00,(Descriptor *)d,(Options *)options);
        DefaultInstanceName_abi_cxx11_
                  ((string *)local_c8,this_00,(Descriptor *)d,(Options *)options);
        options = (code *)local_c8;
        Formatter::operator()
                  (&local_a8,"extern __attribute__((weak)) $1$ $2$;\n",&local_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
      }
      if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
        operator_delete((void *)local_c8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      _Var4._M_current = _Var4._M_current + 1;
    } while (_Var4._M_current != local_68._M_current);
  }
  if (local_70._M_current != (Descriptor **)0x0) {
    operator_delete(local_70._M_current);
  }
  NamespaceOpener::~NamespaceOpener((NamespaceOpener *)&local_58);
  anon_unknown_60::Sorted<google::protobuf::FileDescriptor>
            ((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              *)&local_f0,
             (unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              *)(local_38 + 0x70));
  if (local_f0._M_dataplus._M_p != (pointer)local_f0._M_string_length) {
    local_d0 = (FileGenerator *)&local_d0->options_;
    _Var3._M_p = local_f0._M_dataplus._M_p;
    do {
      DescriptorTableName_abi_cxx11_
                ((string *)&local_58,*(cpp **)_Var3._M_p,(FileDescriptor *)local_d0,
                 (Options *)options);
      Formatter::operator()
                (&local_a8,
                 "extern __attribute__((weak)) const ::$proto_ns$::internal::DescriptorTable $1$;\n"
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._0_8_ != &aStack_48) {
        operator_delete((void *)local_58._0_8_);
      }
      _Var3._M_p = _Var3._M_p + 8;
    } while (_Var3._M_p != (pointer)local_f0._M_string_length);
  }
  if (local_f0._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_a8.vars_._M_t);
  return;
}

Assistant:

void FileGenerator::GenerateInternalForwardDeclarations(
    const CrossFileReferences& refs, io::Printer* printer) {
  Formatter format(printer, variables_);

  {
    NamespaceOpener ns(format);
    for (auto instance : Sorted(refs.weak_default_instances)) {
      ns.ChangeTo(Namespace(instance, options_));
      if (options_.lite_implicit_weak_fields) {
        format("extern $1$ $2$;\n", DefaultInstanceType(instance, options_),
               DefaultInstanceName(instance, options_));
        format("__attribute__((weak)) $1$* $2$ = nullptr;\n",
               DefaultInstanceType(instance, options_),
               DefaultInstancePtr(instance, options_));
      } else {
        format("extern __attribute__((weak)) $1$ $2$;\n",
               DefaultInstanceType(instance, options_),
               DefaultInstanceName(instance, options_));
      }
    }
  }

  for (auto file : Sorted(refs.weak_reflection_files)) {
    format(
        "extern __attribute__((weak)) const "
        "::$proto_ns$::internal::DescriptorTable $1$;\n",
        DescriptorTableName(file, options_));
  }
}